

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall NavierStokesBase::post_restart(NavierStokesBase *this)

{
  ostringstream *this_00;
  int iVar1;
  Amr *pAVar2;
  pointer pcVar3;
  pointer pSVar4;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> _Var5;
  double time;
  char cVar6;
  TimeCenter TVar7;
  StateDescriptor *d;
  long lVar8;
  size_type __new_size;
  string File;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  string file;
  string fileCharPtrString;
  string line;
  istringstream isp;
  string local_258;
  Vector<char,_std::allocator<char>_> local_238;
  Real local_218;
  long *local_210;
  long local_208;
  long local_200 [2];
  long *local_1f0 [2];
  long local_1e0 [2];
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  undefined1 local_1b0 [392];
  
  make_rho_prev_time(this);
  make_rho_curr_time(this);
  if (0 < avg_interval) {
    __new_size = (long)*(int *)&(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.
                                super_AmrInfo.field_0x8c + 1;
    std::vector<double,_std::allocator<double>_>::resize
              (&time_avg.super_vector<double,_std::allocator<double>_>,__new_size);
    std::vector<double,_std::allocator<double>_>::resize
              (&time_avg_fluct.super_vector<double,_std::allocator<double>_>,__new_size);
    std::vector<double,_std::allocator<double>_>::resize
              (&dt_avg.super_vector<double,_std::allocator<double>_>,__new_size);
    if (average_in_checkpoint == 0) {
      local_1b0._8_8_ = amrex::OutStream();
      local_1b0._0_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x30);
      this_00 = (ostringstream *)(local_1b0 + 0x10);
      local_1b0._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
      std::__cxx11::ostringstream::ostringstream(this_00);
      *(undefined8 *)(local_1b0 + *(long *)(local_1b0._16_8_ + -0x18) + 0x18) =
           *(undefined8 *)(local_1b0._8_8_ + *(long *)(*(long *)local_1b0._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"WARNING! Average not found in checkpoint file. Creating data",
                 0x3c);
      std::ios::widen((char)*(undefined8 *)(local_1b0._16_8_ + -0x18) + (char)this_00);
      std::ostream::put((char)this_00);
      std::ostream::flush();
      amrex::Print::~Print((Print *)local_1b0);
      pSVar4 = (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      TVar7 = amrex::StateDescriptor::timeType(pSVar4->desc);
      if (TVar7 == Point) {
        time = (pSVar4->new_time).stop;
      }
      else {
        time = ((pSVar4->new_time).start + (pSVar4->new_time).stop) * 0.5;
      }
      pSVar4 = (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      TVar7 = amrex::StateDescriptor::timeType(pSVar4->desc);
      if (TVar7 == Point) {
        local_218 = (pSVar4->old_time).stop;
      }
      else {
        local_218 = ((pSVar4->old_time).start + (pSVar4->old_time).stop) * 0.5;
      }
      lVar8 = (long)Average_Type;
      pSVar4 = (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_218 = time - local_218;
      d = amrex::DescriptorList::operator[]
                    ((DescriptorList *)amrex::AmrLevel::desc_lst,Average_Type);
      amrex::StateData::define
                (pSVar4 + lVar8,&(this->super_AmrLevel).geom.domain,&(this->super_AmrLevel).grids,
                 &(this->super_AmrLevel).dmap,d,time,local_218,
                 (this->super_AmrLevel).m_factory._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      _Var5.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start[Average_Type].new_data._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 _Var5.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
                 *(int *)((long)_Var5.
                                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc
                         ),
                 (IntVect *)
                 ((long)_Var5.
                        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
      amrex::StateData::allocOldData
                ((this->super_AmrLevel).state.
                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start + Average_Type);
      _Var5.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start[Average_Type].old_data._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 _Var5.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
                 *(int *)((long)_Var5.
                                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc
                         ),
                 (IntVect *)
                 ((long)_Var5.
                        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
      iVar1 = (this->super_AmrLevel).level;
      dt_avg.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar1] = 0.0;
      time_avg.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar1] = 0.0;
      time_avg_fluct.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar1] = 0.0;
    }
    else {
      local_1c8 = 0;
      local_1c0 = 0;
      pAVar2 = (this->super_AmrLevel).parent;
      pcVar3 = (pAVar2->restart_chkfile)._M_dataplus._M_p;
      local_210 = local_200;
      local_1d0 = &local_1c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar3,pcVar3 + (pAVar2->restart_chkfile)._M_string_length);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_210,local_208 + (long)local_210);
      std::__cxx11::string::append((char *)&local_258);
      local_238.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
           (char *)0x0;
      local_238.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      local_238.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1b0._0_4_ = amrex::ParallelDescriptor::m_comm;
      amrex::ParallelDescriptor::ReadAndBcastFile(&local_258,&local_238,true,(MPI_Comm *)local_1b0);
      std::__cxx11::string::string
                ((string *)local_1f0,
                 local_238.super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start,(allocator *)local_1b0);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_1b0,(string *)local_1f0,_S_in);
      cVar6 = std::ios::widen((char)(istringstream *)local_1b0 +
                              (char)*(undefined8 *)
                                     (CONCAT44(local_1b0._4_4_,local_1b0._0_4_) + -0x18));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_1b0,(string *)&local_1d0,cVar6);
      std::istream::_M_extract<double>((double *)local_1b0);
      std::istream::_M_extract<double>((double *)local_1b0);
      dt_avg.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [(this->super_AmrLevel).level] = 0.0;
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0],local_1e0[0] + 1);
      }
      if (local_238.super_vector<char,_std::allocator<char>_>.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
          != (char *)0x0) {
        operator_delete(local_238.super_vector<char,_std::allocator<char>_>.
                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_238.super_vector<char,_std::allocator<char>_>.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.super_vector<char,_std::allocator<char>_>.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if (local_210 != local_200) {
        operator_delete(local_210,local_200[0] + 1);
      }
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
      }
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::post_restart ()
{
    make_rho_prev_time();
    make_rho_curr_time();

  if (avg_interval > 0){

    const int   finest_level = parent->finestLevel();
    NavierStokesBase::time_avg.resize(finest_level+1);
    NavierStokesBase::time_avg_fluct.resize(finest_level+1);
    NavierStokesBase::dt_avg.resize(finest_level+1);

    //
    // We assume that if Average_Type is not present, we have just activated
    // the start of averaging
    //
    if ( average_in_checkpoint==0 )
    {
      Print()<<"WARNING! Average not found in checkpoint file. Creating data"
             <<std::endl;

      Real cur_time = state[State_Type].curTime();
      Real prev_time = state[State_Type].prevTime();
      Real dt = cur_time - prev_time;
      state[Average_Type].define(geom.Domain(), grids, dmap, desc_lst[Average_Type],
                               cur_time, dt, Factory());

      MultiFab& Savg   = get_new_data(Average_Type);
      Savg.setVal(0.);
      state[Average_Type].allocOldData();
      MultiFab& Savg_old   = get_old_data(Average_Type);
      Savg_old.setVal(0.);

      NavierStokesBase::dt_avg[level]   = 0;
      NavierStokesBase::time_avg[level] = 0;
      NavierStokesBase::time_avg_fluct[level] = 0;


    }else{
      //
      // If Average_Type data were found, this means that we need to recover the
      // value of time_average
      //
      std::string line;
      std::string file=parent->theRestartFile();

      std::string File(file + "/TimeAverage");
      Vector<char> fileCharPtr;
      ParallelDescriptor::ReadAndBcastFile(File, fileCharPtr);
      std::string fileCharPtrString(fileCharPtr.dataPtr());
      std::istringstream isp(fileCharPtrString, std::istringstream::in);

      // read in title line
      std::getline(isp, line);

      isp >> NavierStokesBase::time_avg[level];
      isp >> NavierStokesBase::time_avg_fluct[level];
      NavierStokesBase::dt_avg[level]   = 0;

    }
  }

// FIXME - should remove ifdef and use runtime parameter instead...
#ifdef AMREX_USE_TURBULENT_FORCING
  //
  // Initialize data structures used for homogenous isentropic forced turbulence.
  // Only need to do it once.
  if (level == 0)
      TurbulentForcing::init_turbulent_forcing(geom.ProbLoArray(),geom.ProbHiArray());
#endif

#ifdef AMREX_PARTICLES
    post_restart_particle ();
#endif
}